

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_eval.cpp
# Opt level: O2

int ON_SubDFaceCornerDex::Compare(ON_SubDFaceCornerDex *lhs,ON_SubDFaceCornerDex *rhs)

{
  int iVar1;
  
  if (lhs == rhs) {
    return 0;
  }
  if (lhs == (ON_SubDFaceCornerDex *)0x0) {
    iVar1 = 1;
  }
  else {
    if (rhs != (ON_SubDFaceCornerDex *)0x0) {
      iVar1 = CompareAll(lhs,rhs);
      return iVar1;
    }
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int ON_SubDFaceCornerDex::Compare(const ON_SubDFaceCornerDex* lhs, const ON_SubDFaceCornerDex* rhs)
{
  // sort nullptr to end
  if (lhs == rhs)
    return 0;
  if (nullptr == lhs)
    return 1;
  if (nullptr == rhs)
    return -1;

  return ON_SubDFaceCornerDex::CompareAll(*lhs, *rhs);
}